

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile_identity_bases
                 (lysc_ctx *ctx,lysp_module *base_pmod,char **bases_p,lysc_ident *ident,
                 lysc_ident ***bases)

{
  lysc_ident *plVar1;
  lysc_ident **pplVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  long lVar5;
  LY_VECODE code;
  int iVar6;
  LY_ERR LVar7;
  char *pcVar8;
  lys_module *plVar9;
  ulong uVar10;
  long *plVar11;
  undefined8 *puVar12;
  long lVar13;
  void *pvVar14;
  char *pcVar15;
  ulong uVar16;
  lysc_ident *plVar17;
  ly_ctx *plVar18;
  char *pcVar19;
  void *pvVar20;
  long lVar21;
  ly_set local_58;
  lysc_ident *local_40;
  ulong local_38;
  
  if (ident == (lysc_ident *)0x0 && bases == (lysc_ident ***)0x0) {
    __assert_fail("ident || bases",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x14c,
                  "LY_ERR lys_compile_identity_bases(struct lysc_ctx *, const struct lysp_module *, const char **, struct lysc_ident *, struct lysc_ident ***)"
                 );
  }
  if (((bases_p != (char **)0x0) && ((char *)0x1 < bases_p[-1])) && (ctx->pmod->version < 2)) {
    pcVar19 = "identityref type";
    if (ident != (lysc_ident *)0x0) {
      pcVar19 = "identity";
    }
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "Multiple bases in %s are allowed only in YANG 1.1 modules.",pcVar19);
    return LY_EVALID;
  }
  pcVar19 = (char *)0x0;
LAB_0013e666:
  if (bases_p == (char **)0x0) {
    pcVar15 = (char *)0x0;
  }
  else {
    pcVar15 = bases_p[-1];
  }
  if (pcVar15 <= pcVar19) {
    return LY_SUCCESS;
  }
  pcVar15 = bases_p[(long)pcVar19];
  pcVar8 = strchr(pcVar15,0x3a);
  if (pcVar8 == (char *)0x0) {
    plVar9 = base_pmod->mod;
  }
  else {
    plVar9 = ly_resolve_prefix(ctx->ctx,pcVar15,(long)pcVar8 - (long)pcVar15,LY_VALUE_SCHEMA,
                               base_pmod);
    pcVar15 = pcVar8 + 1;
  }
  if (plVar9 == (lys_module *)0x0) {
    plVar18 = ctx->ctx;
    pcVar19 = bases_p[(long)pcVar19];
    if (ident != (lysc_ident *)0x0) {
      pcVar15 = ident->name;
      pcVar8 = "Invalid prefix used for base (%s) of identity \"%s\".";
LAB_0013e943:
      ly_vlog(plVar18,(char *)0x0,LYVE_SYNTAX_YANG,pcVar8,pcVar19,pcVar15);
      return LY_EVALID;
    }
    pcVar15 = "Invalid prefix used for base (%s) of identityref.";
LAB_0013e958:
    code = LYVE_SYNTAX_YANG;
LAB_0013e95a:
    ly_vlog(plVar18,(char *)0x0,code,pcVar15,pcVar19);
    return LY_EVALID;
  }
  plVar17 = plVar9->identities;
  lVar21 = 0;
  uVar16 = 0;
  while( true ) {
    if (plVar17 == (lysc_ident *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = *(ulong *)&plVar17[-1].flags;
    }
    if (uVar10 <= uVar16) {
      plVar18 = ctx->ctx;
      pcVar19 = bases_p[(long)pcVar19];
      if (ident == (lysc_ident *)0x0) {
        pcVar15 = "Unable to find base (%s) of identityref.";
        goto LAB_0013e958;
      }
      pcVar15 = ident->name;
      pcVar8 = "Unable to find base (%s) of identity \"%s\".";
      goto LAB_0013e943;
    }
    iVar6 = strcmp(pcVar15,*(char **)((long)&plVar17->name + lVar21));
    if (iVar6 == 0) break;
    uVar16 = uVar16 + 1;
    lVar21 = lVar21 + 0x38;
  }
  if (ident != (lysc_ident *)0x0) {
    plVar1 = (lysc_ident *)((long)&plVar17->name + lVar21);
    if (plVar1 == ident) {
      plVar18 = ctx->ctx;
      pcVar19 = ident->name;
      pcVar15 = "Identity \"%s\" is derived from itself.";
      code = LYVE_REFERENCE;
      goto LAB_0013e95a;
    }
    pplVar2 = ident->derived;
    local_58.size = 0;
    local_58.count = 0;
    local_58.field_2.dnodes = (lyd_node **)0x0;
    local_40 = ident;
    if (pplVar2 != (lysc_ident **)0x0) {
      plVar17 = (lysc_ident *)0x0;
LAB_0013e727:
      if (plVar17 < pplVar2[-1]) {
        if (plVar1 != pplVar2[(long)plVar17]) goto code_r0x0013e73f;
LAB_0013e853:
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                "Identity \"%s\" is indirectly derived from itself.",plVar1->name);
        LVar7 = LY_EVALID;
      }
      else {
        uVar16 = 0;
        while (uVar16 < (ulong)local_58._0_8_ >> 0x20) {
          plVar3 = local_58.field_2.dnodes[uVar16];
          pvVar20 = (void *)0x0;
          local_38 = uVar16;
          while( true ) {
            plVar4 = plVar3->prev;
            if (plVar4 == (lyd_node *)0x0) {
              pvVar14 = (void *)0x0;
            }
            else {
              pvVar14 = plVar4[-1].priv;
            }
            if (pvVar14 <= pvVar20) break;
            if (plVar1 == *(lysc_ident **)(&plVar4->hash + (long)pvVar20 * 2)) goto LAB_0013e853;
            LVar7 = ly_set_add(&local_58,*(lysc_ident **)(&plVar4->hash + (long)pvVar20 * 2),'\0',
                               (uint32_t *)0x0);
            pvVar20 = (void *)((long)pvVar20 + 1);
            if (LVar7 != LY_SUCCESS) goto LAB_0013e875;
          }
          uVar16 = local_38 + 1;
        }
        LVar7 = LY_SUCCESS;
      }
      goto LAB_0013e875;
    }
    goto LAB_0013e898;
  }
  pplVar2 = *bases;
  if (pplVar2 == (lysc_ident **)0x0) {
    plVar11 = (long *)malloc(0x10);
    if (plVar11 == (long *)0x0) goto LAB_0013e9c6;
    *plVar11 = 1;
    lVar13 = 1;
  }
  else {
    plVar17 = pplVar2[-1];
    pplVar2[-1] = (lysc_ident *)((long)&plVar17->name + 1);
    plVar11 = (long *)realloc(pplVar2 + -1,(long)plVar17 * 8 + 0x10);
    if (plVar11 == (long *)0x0) {
      (*bases)[-1] = (lysc_ident *)&(*bases)[-1][-1].field_0x37;
      plVar18 = ctx->ctx;
      goto LAB_0013ea0c;
    }
    lVar13 = *plVar11;
  }
  *bases = (lysc_ident **)(plVar11 + 1);
  plVar11[lVar13] = 0;
  plVar11[lVar13] = (long)&plVar9->identities->name + lVar21;
  goto LAB_0013e905;
code_r0x0013e73f:
  LVar7 = ly_set_add(&local_58,pplVar2[(long)plVar17],'\0',(uint32_t *)0x0);
  plVar17 = (lysc_ident *)((long)&plVar17->name + 1);
  if (LVar7 != LY_SUCCESS) goto LAB_0013e875;
  goto LAB_0013e727;
LAB_0013e875:
  ly_set_erase(&local_58,(_func_void_void_ptr *)0x0);
  if (LVar7 != LY_SUCCESS) {
    return LVar7;
  }
  plVar17 = plVar9->identities;
LAB_0013e898:
  ident = local_40;
  lVar13 = *(long *)((long)&plVar17->derived + lVar21);
  if (lVar13 == 0) {
    puVar12 = (undefined8 *)malloc(0x10);
    if (puVar12 == (undefined8 *)0x0) goto LAB_0013e9c6;
    *puVar12 = 1;
  }
  else {
    lVar5 = *(long *)(lVar13 + -8);
    *(long *)(lVar13 + -8) = lVar5 + 1;
    puVar12 = (undefined8 *)realloc((void *)(lVar13 + -8),lVar5 * 8 + 0x10);
    plVar17 = plVar9->identities;
    if (puVar12 == (undefined8 *)0x0) {
      plVar11 = (long *)(*(long *)((long)&plVar17->derived + lVar21) + -8);
      *plVar11 = *plVar11 + -1;
LAB_0013e9c6:
      plVar18 = ctx->ctx;
LAB_0013ea0c:
      ly_log(plVar18,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_identity_bases");
      return LY_EMEM;
    }
  }
  *(undefined8 **)((long)&plVar17->derived + lVar21) = puVar12 + 1;
  lVar21 = *(long *)((long)&plVar9->identities->derived + lVar21);
  *(lysc_ident **)(lVar21 + -8 + *(long *)(lVar21 + -8) * 8) = ident;
LAB_0013e905:
  pcVar19 = pcVar19 + 1;
  goto LAB_0013e666;
}

Assistant:

LY_ERR
lys_compile_identity_bases(struct lysc_ctx *ctx, const struct lysp_module *base_pmod, const char **bases_p,
        struct lysc_ident *ident, struct lysc_ident ***bases)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const char *s, *name;
    const struct lys_module *mod;
    struct lysc_ident **idref;

    assert(ident || bases);

    if ((LY_ARRAY_COUNT(bases_p) > 1) && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                "Multiple bases in %s are allowed only in YANG 1.1 modules.", ident ? "identity" : "identityref type");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(bases_p, u) {
        s = strchr(bases_p[u], ':');
        if (s) {
            /* prefixed identity */
            name = &s[1];
            mod = ly_resolve_prefix(ctx->ctx, bases_p[u], s - bases_p[u], LY_VALUE_SCHEMA, (void *)base_pmod);
        } else {
            name = bases_p[u];
            mod = base_pmod->mod;
        }
        if (!mod) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }

        idref = NULL;
        LY_ARRAY_FOR(mod->identities, v) {
            if (!strcmp(name, mod->identities[v].name)) {
                if (ident) {
                    if (ident == &mod->identities[v]) {
                        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                                "Identity \"%s\" is derived from itself.", ident->name);
                        return LY_EVALID;
                    }
                    LY_CHECK_RET(lys_compile_identity_circular_check(ctx, &mod->identities[v], ident->derived));
                    /* we have match! store the backlink */
                    LY_ARRAY_NEW_RET(ctx->ctx, mod->identities[v].derived, idref, LY_EMEM);
                    *idref = ident;
                } else {
                    /* we have match! store the found identity */
                    LY_ARRAY_NEW_RET(ctx->ctx, *bases, idref, LY_EMEM);
                    *idref = &mod->identities[v];
                }
                break;
            }
        }
        if (!idref) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}